

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O2

word zzSub2(word *b,word *a,size_t n)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  word wVar4;
  ulong uVar5;
  size_t sVar6;
  
  wVar4 = 0;
  for (sVar6 = 0; n != sVar6; sVar6 = sVar6 + 1) {
    uVar3 = a[sVar6];
    uVar5 = wVar4 + a[sVar6];
    puVar1 = b + sVar6;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 - uVar5;
    wVar4 = (word)(uVar2 < uVar5 || CARRY8(wVar4,uVar3));
  }
  return wVar4;
}

Assistant:

word zzSub2(word b[], const word a[], size_t n)
{
	register word borrow = 0;
	register word w;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
#ifndef SAFE_FAST
		w = a[i] + borrow;
		borrow = wordLess01(w, borrow);
		borrow |= wordLess01(b[i], w);
		b[i] -= w;
#else
		w = b[i] - borrow;
		if (w > (word)~borrow)
			w = ~a[i];
		else
			w -= a[i], borrow = w > (word)~a[i];
		b[i] = w;
#endif
	}
	w = 0;
	return borrow;
}